

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

result_type __thiscall
Well<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_Detail::M3<-21>,_Detail::M3<17>,_Detail::M4<2346498334U>,_Detail::M3<15>,_Detail::M3<-14>,_Detail::M3<-21>,_Detail::M1,_Detail::M0,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_Detail::M3<_21>,_Detail::M3<17>,_Detail::M4<2346498334U>,_Detail::M3<15>,_Detail::M3<_14>,_Detail::M3<_21>,_Detail::M1,_Detail::M0,_Detail::NoTempering>
             *this)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  sVar1 = this->index_;
  iVar2 = (int)sVar1;
  uVar4 = (ulong)(iVar2 - 1U & 0x1f);
  uVar3 = this->state_[sVar1] ^ this->state_[iVar2 + 0x16U & 0x1f] ^
          (this->state_[iVar2 + 0x16U & 0x1f] >> 0x11 | this->state_[sVar1] << 0x15);
  uVar5 = this->state_[iVar2 + 0x19U & 0x1f] >> 1;
  uVar6 = uVar5 ^ 0x8bdcb91e;
  if ((this->state_[iVar2 + 0x19U & 0x1f] & 1) == 0) {
    uVar6 = uVar5;
  }
  uVar6 = this->state_[iVar2 + 0x1aU & 0x1f] >> 0xf ^ this->state_[iVar2 + 0x1aU & 0x1f] ^ uVar6;
  uVar5 = uVar3 << 0x15 ^ this->state_[uVar4] << 0xe ^ uVar3 ^ uVar6 ^ this->state_[uVar4];
  this->state_[sVar1] = uVar6 ^ uVar3;
  this->state_[uVar4] = uVar5;
  this->index_ = uVar4;
  return uVar5;
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }